

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *info;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  size_t bytewidth;
  uchar *puVar9;
  uchar *out_00;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint y;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  size_t local_240;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t passstart [8];
  size_t filter_passstart [8];
  size_t passstart_1 [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  info = &info_png->color;
  uVar7 = lodepng_get_bpp(info);
  if (info_png->interlace_method == 0) {
    uVar8 = uVar7 * w;
    uVar10 = (uVar8 + 7 >> 3) * h;
    uVar14 = uVar10 + h;
    *outsize = (ulong)uVar14;
    puVar9 = (uchar *)malloc((ulong)uVar14);
    *out = puVar9;
    if (uVar14 != 0 && puVar9 == (uchar *)0x0) {
      return 0x53;
    }
    if ((7 < uVar7) || (uVar7 = uVar8 + 7 & 0xfffffff8, uVar8 == uVar7)) {
      uVar7 = filter(puVar9,in,w,h,info,settings);
      return uVar7;
    }
    out_00 = (uchar *)malloc((ulong)uVar10);
    if (out_00 == (uchar *)0x0) {
      uVar8 = 0x53;
    }
    else {
      addPaddingBits(out_00,in,(ulong)uVar7,(ulong)uVar8,h);
      uVar8 = filter(puVar9,out_00,w,h,info,settings);
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar7);
    *outsize = filter_passstart[7];
    puVar9 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar9;
    out_00 = (uchar *)malloc(passstart[7]);
    if ((puVar9 == (uchar *)0x0) || (passstart[7] != 0 && out_00 == (uchar *)0x0)) {
LAB_0011e6ec:
      uVar8 = 0x53;
    }
    else {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,passstart_1,w,h,
                          uVar7);
      if (uVar7 < 8) {
        for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
          uVar8 = passw_1[lVar11];
          uVar14 = passh_1[lVar11];
          for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
            for (uVar16 = 0; uVar16 != uVar8; uVar16 = uVar16 + 1) {
              uVar15 = (ulong)((ADAM7_DX[lVar11] * (int)uVar16 + ADAM7_IX[lVar11] +
                               (ADAM7_DY[lVar11] * uVar10 + ADAM7_IY[lVar11]) * w) * uVar7);
              local_240 = (ulong)((uVar10 * uVar8 + (int)uVar16) * uVar7) + passstart_1[lVar11] * 8;
              uVar12 = uVar7;
              while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
                uVar13 = uVar15 >> 3;
                bVar6 = (byte)uVar15;
                uVar15 = uVar15 + 1;
                setBitOfReversedStream(&local_240,out_00,(in[uVar13] >> (~bVar6 & 7) & 1) != 0);
              }
            }
          }
        }
      }
      else {
        uVar16 = (ulong)(uVar7 >> 3);
        for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
          uVar8 = passh_1[lVar11];
          for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
            uVar10 = passw_1[lVar11];
            uVar12 = uVar10 * uVar14;
            for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
              sVar5 = passstart_1[lVar11];
              uVar1 = ADAM7_DX[lVar11];
              uVar2 = ADAM7_IX[lVar11];
              uVar3 = ADAM7_DY[lVar11];
              uVar4 = ADAM7_IY[lVar11];
              for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                out_00[uVar13 + uVar12 * uVar16 + sVar5] =
                     in[uVar13 + ((uVar3 * uVar14 + uVar4) * w + uVar1 * (int)uVar15 + uVar2) *
                                 uVar16];
              }
              uVar12 = uVar12 + 1;
            }
          }
        }
      }
      lVar11 = 0;
      do {
        if (lVar11 == 7) {
          uVar8 = 0;
          break;
        }
        if (uVar7 < 8) {
          puVar9 = (uchar *)malloc(padded_passstart[lVar11 + 1] - padded_passstart[lVar11]);
          if (puVar9 == (uchar *)0x0) goto LAB_0011e6ec;
          uVar8 = passw[lVar11];
          uVar10 = uVar8 * uVar7;
          uVar14 = passh[lVar11];
          addPaddingBits(puVar9,out_00 + passstart[lVar11],(ulong)(uVar10 + 7 & 0xfffffff8),
                         (ulong)uVar10,uVar14);
          uVar8 = filter(*out + filter_passstart[lVar11],puVar9,uVar8,uVar14,info,settings);
          free(puVar9);
        }
        else {
          uVar8 = filter(*out + filter_passstart[lVar11],out_00 + padded_passstart[lVar11],
                         passw[lVar11],passh[lVar11],info,settings);
        }
        lVar11 = lVar11 + 1;
      } while (uVar8 == 0);
    }
  }
  free(out_00);
  return uVar8;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0) {
    *outsize = h + (h * ((w * bpp + 7u) / 8u)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, ((w * bpp + 7u) / 8u) * 8u, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7u) / 8u) * 8u, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}